

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GUIAbout.cpp
# Opt level: O0

void __thiscall GUIAbout::GUIAbout(GUIAbout *this)

{
  QTextDocument *this_00;
  QTextBrowser *pQVar1;
  WidgetAttribute WVar2;
  QFlags<Qt::AlignmentFlag> local_8c;
  QTextBrowser *local_88;
  QTextBrowser *browser;
  QTextDocument *doc;
  QString html;
  QVBoxLayout layout;
  QString local_40;
  QFlags<Qt::WindowType> local_14;
  GUIAbout *local_10;
  GUIAbout *this_local;
  
  local_10 = this;
  QFlags<Qt::WindowType>::QFlags(&local_14);
  QDialog::QDialog(&this->super_QDialog,(QWidget *)0x0,(QFlags_conflict *)(ulong)local_14.i);
  *(undefined ***)this = &PTR_metaObject_00163ae8;
  *(undefined ***)&this->field_0x10 = &PTR__GUIAbout_00163cc0;
  QDialog::setModal(SUB81(this,0));
  WVar2 = (WidgetAttribute)this;
  QWidget::setMinimumSize(WVar2,500);
  QWidget::setMaximumSize(WVar2,500);
  QString::QString(&local_40," ");
  QWidget::setWindowTitle((QString *)this);
  QString::~QString(&local_40);
  QWidget::setAttribute(WVar2,true);
  QVBoxLayout::QVBoxLayout((QVBoxLayout *)&html.d.size,(QWidget *)this);
  QString::QString((QString *)&doc);
  QString::append((QString *)&doc,"<br/><pre>  Author:       Przemyslaw Madej</pre>");
  QString::append((QString *)&doc,"<pre>  Web page:     http://przemeknet.pl/fifteen.html</pre>");
  this_00 = (QTextDocument *)operator_new(0x10);
  QTextDocument::QTextDocument(this_00,(QObject *)this);
  browser = (QTextBrowser *)this_00;
  QTextDocument::setHtml((QString *)this_00);
  pQVar1 = (QTextBrowser *)operator_new(0x28);
  QTextBrowser::QTextBrowser(pQVar1,(QWidget *)this);
  local_88 = pQVar1;
  QTextEdit::setDocument((QTextDocument *)pQVar1);
  pQVar1 = local_88;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_8c);
  QBoxLayout::addWidget((QWidget *)&html.d.size,(int)pQVar1,(QFlags_conflict *)0x0);
  QWidget::show();
  QString::~QString((QString *)&doc);
  QVBoxLayout::~QVBoxLayout((QVBoxLayout *)&html.d.size);
  return;
}

Assistant:

GUIAbout::GUIAbout()
{
    setModal( true );
    setMinimumSize( 500, 170 );
    setMaximumSize( 500, 170 );
    setWindowTitle( " " );
    setAttribute( Qt::WA_DeleteOnClose );

    QVBoxLayout layout( this );
    QString html;

    html.append( "<br/><pre>  Author:       Przemyslaw Madej</pre>" );
    html.append( "<pre>  Web page:     http://przemeknet.pl/fifteen.html</pre>" );

    QTextDocument* doc = new QTextDocument( this );
    doc->setHtml( html );
    QTextBrowser* browser = new QTextBrowser( this );
    browser->setDocument( doc );
    layout.addWidget( browser );
    show();
}